

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::TimeZoneFormat::parseSingleLocalizedDigit
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,int32_t *len)

{
  short sVar1;
  int iVar2;
  UChar32 c;
  uint uVar3;
  int32_t iVar4;
  int32_t i;
  ulong uVar5;
  
  *len = 0;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  iVar4 = -1;
  if (start < iVar2) {
    c = UnicodeString::char32At(text,start);
    uVar5 = 0;
    do {
      if (c == this->fGMTOffsetDigits[uVar5]) goto LAB_00200bbd;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 10);
    uVar3 = u_charDigitValue_63(c);
    uVar5 = (ulong)uVar3;
    if (uVar3 < 10) {
LAB_00200bbd:
      iVar4 = UnicodeString::moveIndex32(text,start,1);
      *len = iVar4 - start;
      iVar4 = (int32_t)uVar5;
    }
  }
  return iVar4;
}

Assistant:

int32_t
TimeZoneFormat::parseSingleLocalizedDigit(const UnicodeString& text, int32_t start, int32_t& len) const {
    int32_t digit = -1;
    len = 0;
    if (start < text.length()) {
        UChar32 cp = text.char32At(start);

        // First, try digits configured for this instance
        for (int32_t i = 0; i < 10; i++) {
            if (cp == fGMTOffsetDigits[i]) {
                digit = i;
                break;
            }
        }
        // If failed, check if this is a Unicode digit
        if (digit < 0) {
            int32_t tmp = u_charDigitValue(cp);
            digit = (tmp >= 0 && tmp <= 9) ? tmp : -1;
        }

        if (digit >= 0) {
            int32_t next = text.moveIndex32(start, 1);
            len = next - start;
        }
    }
    return digit;
}